

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void pack_txb_tokens(aom_writer *w,AV1_COMMON *cm,MACROBLOCK *x,TokenExtra **tp,TokenExtra *tok_end,
                    MACROBLOCKD *xd,MB_MODE_INFO *mbmi,int plane,BLOCK_SIZE plane_bsize,
                    aom_bit_depth_t bit_depth,int block,int blk_row,int blk_col,TX_SIZE tx_size,
                    TOKEN_STATS *token_stats)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MACROBLOCK *in_RCX;
  AV1_COMMON *in_RDX;
  aom_writer *in_RSI;
  TokenExtra **in_R8;
  MACROBLOCKD *in_R9;
  MB_MODE_INFO *unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  BLOCK_SIZE BStack0000000000000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  TX_SIZE TStack0000000000000038;
  byte in_stack_00000040;
  undefined7 in_stack_00000041;
  int offsetc;
  int c;
  int offsetr;
  int r;
  int col_end;
  int row_end;
  int step;
  int bsh;
  int bsw;
  TX_SIZE sub_txs;
  TX_SIZE plane_tx_size;
  macroblockd_plane *pd;
  int max_blocks_wide;
  int max_blocks_high;
  int in_stack_00001564;
  int in_stack_00001568;
  int in_stack_0000156c;
  aom_writer *in_stack_00001570;
  MACROBLOCK *in_stack_00001578;
  AV1_COMMON *in_stack_00001580;
  int in_stack_000015c0;
  TX_SIZE in_stack_000015c8;
  undefined8 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  BLOCK_SIZE in_stack_ffffffffffffff17;
  int local_b0;
  int local_ac;
  int local_94;
  int local_8c;
  
  iVar3 = max_block_high(in_R9,BStack0000000000000018,in_stack_00000010);
  iVar4 = max_block_wide(in_R9,BStack0000000000000018,in_stack_00000010);
  if ((in_stack_00000030 < iVar3) && (_TStack0000000000000038 < iVar4)) {
    if (in_stack_00000010 == 0) {
      iVar5 = av1_get_txb_size_index
                        (BStack0000000000000018,in_stack_00000030,_TStack0000000000000038);
      bVar2 = *(byte *)(CONCAT44(in_stack_0000000c,in_stack_00000008) + 0x92 + (long)iVar5);
    }
    else {
      bVar2 = av1_get_max_uv_txsize
                        (in_stack_ffffffffffffff17,in_stack_ffffffffffffff10,
                         (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    }
    if ((in_stack_00000040 == bVar2) || (in_stack_00000010 != 0)) {
      av1_write_coeffs_txb
                (in_stack_00001580,in_stack_00001578,in_stack_00001570,in_stack_0000156c,
                 in_stack_00001568,in_stack_00001564,in_stack_000015c0,in_stack_000015c8);
    }
    else {
      iVar5 = tx_size_wide_unit[""[in_stack_00000040]];
      iVar1 = tx_size_high_unit[""[in_stack_00000040]];
      if (tx_size_high_unit[in_stack_00000040] < iVar3 - in_stack_00000030) {
        local_ac = tx_size_high_unit[in_stack_00000040];
      }
      else {
        local_ac = iVar3 - in_stack_00000030;
      }
      if (tx_size_wide_unit[in_stack_00000040] < iVar4 - _TStack0000000000000038) {
        local_b0 = tx_size_wide_unit[in_stack_00000040];
      }
      else {
        local_b0 = iVar4 - _TStack0000000000000038;
      }
      for (local_8c = 0; local_8c < local_ac; local_8c = iVar1 + local_8c) {
        for (local_94 = 0; local_94 < local_b0; local_94 = iVar5 + local_94) {
          pack_txb_tokens(in_RSI,in_RDX,in_RCX,in_R8,(TokenExtra *)in_R9,
                          (MACROBLOCKD *)CONCAT44(iVar3,iVar4),unaff_retaddr,in_stack_00000008,
                          BLOCK_4X4,_BStack0000000000000018,in_stack_00000020,in_stack_00000028,
                          in_stack_00000030,TStack0000000000000038,
                          (TOKEN_STATS *)CONCAT71(in_stack_00000041,in_stack_00000040));
          in_stack_00000028 = iVar1 * iVar5 + in_stack_00000028;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void pack_txb_tokens(
    aom_writer *w, AV1_COMMON *cm, MACROBLOCK *const x, const TokenExtra **tp,
    const TokenExtra *const tok_end, MACROBLOCKD *xd, MB_MODE_INFO *mbmi,
    int plane, BLOCK_SIZE plane_bsize, aom_bit_depth_t bit_depth, int block,
    int blk_row, int blk_col, TX_SIZE tx_size, TOKEN_STATS *token_stats) {
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const TX_SIZE plane_tx_size =
      plane ? av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                                    pd->subsampling_y)
            : mbmi->inter_tx_size[av1_get_txb_size_index(plane_bsize, blk_row,
                                                         blk_col)];

  if (tx_size == plane_tx_size || plane) {
    av1_write_coeffs_txb(cm, x, w, blk_row, blk_col, plane, block, tx_size);
#if CONFIG_RD_DEBUG
    TOKEN_STATS tmp_token_stats;
    init_token_stats(&tmp_token_stats);
    token_stats->cost += tmp_token_stats.cost;
#endif
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int step = bsh * bsw;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);

    assert(bsw > 0 && bsh > 0);

    for (int r = 0; r < row_end; r += bsh) {
      const int offsetr = blk_row + r;
      for (int c = 0; c < col_end; c += bsw) {
        const int offsetc = blk_col + c;
        pack_txb_tokens(w, cm, x, tp, tok_end, xd, mbmi, plane, plane_bsize,
                        bit_depth, block, offsetr, offsetc, sub_txs,
                        token_stats);
        block += step;
      }
    }
  }
}